

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O2

float __thiscall Sequence<DNA>::NumExpectedErrors(Sequence<DNA> *this)

{
  size_type sVar1;
  pointer pcVar2;
  byte bVar3;
  size_type sVar4;
  float fVar5;
  double dVar6;
  
  sVar1 = (this->quality)._M_string_length;
  if (sVar1 == 0) {
    fVar5 = 0.0;
  }
  else {
    pcVar2 = (this->quality)._M_dataplus._M_p;
    fVar5 = 0.0;
    for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
      FASTQ::QScore::Instance();
      bVar3 = pcVar2[sVar4];
      if ((char)bVar3 < '\"') {
        bVar3 = 0x21;
      }
      if ('I' < (char)bVar3) {
        bVar3 = 0x4a;
      }
      dVar6 = pow(10.0,(double)(int)(bVar3 - 0x21) / -10.0);
      fVar5 = (float)((double)fVar5 + dVar6);
    }
  }
  return fVar5;
}

Assistant:

float Sequence< A >::NumExpectedErrors() const {
  if( quality.empty() )
    return 0.0f;

  float numExpectedErrors = 0.0f;
  for( auto &q : quality ) {
    numExpectedErrors += FASTQ::QScore::Instance().AsciiToProbability( q );
  }
  return numExpectedErrors;
}